

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::UsesDefaultOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact)

{
  bool bVar1;
  string dir;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = ComputeOutputDir(this,config,artifact,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

const std::string& Evaluate(cmLocalGenerator* lg, const std::string& config,
                              cmGeneratorTarget const* headTarget,
                              cmGeneratorExpressionDAGChecker* dagChecker,
                              std::string const& /*lang*/) const override
  {
    std::map<std::string, std::vector<std::string>> filesPerDir;
    this->FileSet->EvaluateFileEntry(this->BaseDirs, filesPerDir,
                                     this->EntryCge, lg, config, headTarget,
                                     dagChecker);

    std::vector<std::string> files;
    for (auto const& it : filesPerDir) {
      files.insert(files.end(), it.second.begin(), it.second.end());
    }

    static std::string filesStr;
    filesStr = cmJoin(files, ";");
    return filesStr;
  }